

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void finish(bfgs *b)

{
  long in_RDI;
  
  v_array<float>::delete_v((v_array<float> *)b);
  free(*(void **)(in_RDI + 0xc0));
  free(*(void **)(in_RDI + 200));
  free(*(void **)(in_RDI + 0xd0));
  return;
}

Assistant:

void finish(bfgs& b)
{
  b.predictions.delete_v();
  free(b.mem);
  free(b.rho);
  free(b.alpha);
}